

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DGXMLScanner::commonInit(DGXMLScanner *this)

{
  MemoryManager *pMVar1;
  XMLSize_t XVar2;
  XMLValidator *pXVar3;
  int iVar4;
  ValueVectorOf<xercesc_4_0::XMLAttr_*> *pVVar5;
  undefined4 extraout_var;
  DTDValidator *this_00;
  NameIdPool<xercesc_4_0::DTDElementDecl> *this_01;
  RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *pRVar6;
  undefined4 extraout_var_00;
  Hash2KeysSetOf<xercesc_4_0::StringHasher> *pHVar7;
  undefined4 extraout_var_01;
  RuntimeException *this_02;
  XMLSize_t XVar8;
  
  pVVar5 = (ValueVectorOf<xercesc_4_0::XMLAttr_*> *)
           XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  pVVar5->fCallDestructor = false;
  pVVar5->fCurCount = 0;
  pVVar5->fMaxCount = 8;
  pVVar5->fElemList = (XMLAttr **)0x0;
  pVVar5->fMemoryManager = pMVar1;
  iVar4 = (*pMVar1->_vptr_MemoryManager[3])();
  pVVar5->fElemList = (XMLAttr **)CONCAT44(extraout_var,iVar4);
  memset((XMLAttr **)CONCAT44(extraout_var,iVar4),0,pVVar5->fMaxCount << 3);
  this->fAttrNSList = pVVar5;
  this_00 = (DTDValidator *)XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  DTDValidator::DTDValidator(this_00,(XMLErrorReporter *)0x0);
  this->fDTDValidator = this_00;
  XMLScanner::initValidator(&this->super_XMLScanner,(XMLValidator *)this_00);
  this_01 = (NameIdPool<xercesc_4_0::DTDElementDecl> *)
            XMemory::operator_new(0x58,(this->super_XMLScanner).fMemoryManager);
  NameIdPool<xercesc_4_0::DTDElementDecl>::NameIdPool
            (this_01,0x1d,0x80,(this->super_XMLScanner).fMemoryManager);
  this->fDTDElemNonDeclPool = this_01;
  pRVar6 = (RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *)
           XMemory::operator_new(0x38,(this->super_XMLScanner).fMemoryManager);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  pRVar6->fMemoryManager = pMVar1;
  pRVar6->fAdoptedElems = false;
  pRVar6->fBucketList = (RefHashTableBucketElem<unsigned_int> **)0x0;
  pRVar6->fHashModulus = 0x83;
  pRVar6->fInitialModulus = 0x83;
  pRVar6->fCount = 0;
  iVar4 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x418);
  pRVar6->fBucketList = (RefHashTableBucketElem<unsigned_int> **)CONCAT44(extraout_var_00,iVar4);
  XVar2 = pRVar6->fHashModulus;
  if (XVar2 != 0) {
    XVar8 = 0;
    do {
      pRVar6->fBucketList[XVar8] = (RefHashTableBucketElem<unsigned_int> *)0x0;
      XVar8 = XVar8 + 1;
    } while (XVar2 != XVar8);
  }
  this->fAttDefRegistry = pRVar6;
  pHVar7 = (Hash2KeysSetOf<xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  pHVar7->fMemoryManager = pMVar1;
  pHVar7->fBucketList = (Hash2KeysSetBucketElem **)0x0;
  pHVar7->fHashModulus = 7;
  pHVar7->fCount = 0;
  pHVar7->fAvailable = (Hash2KeysSetBucketElem *)0x0;
  iVar4 = (*pMVar1->_vptr_MemoryManager[3])();
  pHVar7->fBucketList = (Hash2KeysSetBucketElem **)CONCAT44(extraout_var_01,iVar4);
  memset((Hash2KeysSetBucketElem **)CONCAT44(extraout_var_01,iVar4),0,pHVar7->fHashModulus << 3);
  this->fUndeclaredAttrRegistry = pHVar7;
  pXVar3 = (this->super_XMLScanner).fValidator;
  if (pXVar3 == (XMLValidator *)0x0) {
    (this->super_XMLScanner).fValidator = &this->fDTDValidator->super_XMLValidator;
  }
  else {
    iVar4 = (*pXVar3->_vptr_XMLValidator[0xc])();
    if ((char)iVar4 == '\0') {
      this_02 = (RuntimeException *)__cxa_allocate_exception(0x30);
      RuntimeException::RuntimeException
                (this_02,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                 ,0x8a0,Gen_NoDTDValidator,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(this_02,&RuntimeException::typeinfo,XMLException::~XMLException);
    }
  }
  return;
}

Assistant:

void DGXMLScanner::commonInit()
{
    //  And we need one for the raw attribute scan. This just stores key/
    //  value string pairs (prior to any processing.)
    fAttrNSList = new (fMemoryManager) ValueVectorOf<XMLAttr*>(8, fMemoryManager);

    //  Create the Validator and init them
    fDTDValidator = new (fMemoryManager) DTDValidator();
    initValidator(fDTDValidator);
    fDTDElemNonDeclPool = new (fMemoryManager) NameIdPool<DTDElementDecl>(29, 128, fMemoryManager);
    fAttDefRegistry = new (fMemoryManager) RefHashTableOf<unsigned int, PtrHasher>
    (
        131, false, fMemoryManager
    );
    fUndeclaredAttrRegistry = new (fMemoryManager) Hash2KeysSetOf<StringHasher>(7, fMemoryManager);

    if (fValidator)
    {
        if (!fValidator->handlesDTD())
           ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Gen_NoDTDValidator, fMemoryManager);
    }
    else
    {
        fValidator = fDTDValidator;
    }
}